

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O2

unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
__thiscall
duckdb::ClientContext::PendingStatementOrPreparedStatementInternal
          (ClientContext *this,ClientContextLock *lock,string *query,
          unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
          *statement,shared_ptr<duckdb::PreparedStatementData,_true> *prepared,
          PendingQueryParameters *parameters)

{
  element_type *peVar1;
  ParserOptions options_p;
  bool bVar2;
  element_type *peVar3;
  pointer pSVar4;
  __uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_> *__u;
  undefined8 *in_stack_00000008;
  ErrorData error;
  Parser parser;
  element_type *local_210;
  _Head_base<0UL,_duckdb::SQLStatement_*,_false> local_208;
  unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *local_200;
  string *local_1f8;
  undefined1 local_1f0 [8];
  string local_1e8;
  ParserOptions local_1c8;
  ErrorData local_1b0;
  ErrorData local_130;
  ErrorData local_b0;
  
  local_1f0 = (undefined1  [8])
              (prepared->internal).
              super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1f8 = query;
  if ((local_1f0 == (undefined1  [8])0x0) ||
     ((((*(char *)&lock[0x1c].client_guard._M_device == '\0' &&
        (*(char *)((long)&lock[0x1c].client_guard._M_device + 1) == '\0')) &&
       (*(char *)((long)&lock[0x1c].client_guard._M_device + 3) == '\0')) &&
      (*(char *)((long)&lock[0x1c].client_guard._M_device + 2) != '\x01')))) goto LAB_019c319b;
  pSVar4 = unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
           operator->((unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                       *)prepared);
  (*pSVar4->_vptr_SQLStatement[3])(&local_210,pSVar4);
  pSVar4 = unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
           operator->((unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                       *)prepared);
  peVar3 = local_210;
  local_200 = statement;
  if (pSVar4->type == SELECT_STATEMENT) {
    ErrorData::ErrorData(&local_1b0);
    local_208._M_head_impl =
         (SQLStatement *)
         (prepared->internal).
         super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (prepared->internal).
    super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    VerifyQuery(&local_130,(ClientContext *)lock,(ClientContextLock *)local_1f8,(string *)statement,
                (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *
                )&local_208,
                (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>
                 *)*in_stack_00000008);
    ErrorData::operator=(&local_1b0,&local_130);
    ErrorData::~ErrorData(&local_130);
    if ((element_type *)local_208._M_head_impl != (element_type *)0x0) {
      (*(local_208._M_head_impl)->_vptr_SQLStatement[1])();
    }
    peVar3 = local_210;
    local_208._M_head_impl = (SQLStatement *)0x0;
    if (local_1b0.initialized == true) {
      ErrorData::ErrorData(&local_b0,&local_1b0);
      ErrorResult<duckdb::PendingQueryResult>(this,(ErrorData *)lock,(string *)&local_b0);
      ErrorData::~ErrorData(&local_b0);
    }
    else {
      local_210 = (element_type *)0x0;
      peVar1 = (prepared->internal).
               super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (prepared->internal).
      super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
      if (peVar1 != (element_type *)0x0) {
        (**(code **)(*(long *)peVar1 + 8))();
      }
    }
    ErrorData::~ErrorData(&local_1b0);
    if (local_1b0.initialized == false) goto LAB_019c317a;
    bVar2 = false;
  }
  else {
    local_210 = (element_type *)0x0;
    peVar1 = (prepared->internal).
             super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (prepared->internal).
    super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
    if (peVar1 != (element_type *)0x0) {
      (**(code **)(*(long *)peVar1 + 8))();
    }
    pSVar4 = unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
             operator->((unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                         *)prepared);
    if (pSVar4->type != RELATION_STATEMENT) {
      GetParserOptions(&local_1c8,(ClientContext *)lock);
      options_p.max_expression_depth = local_1c8.max_expression_depth;
      options_p.preserve_identifier_case = local_1c8.preserve_identifier_case;
      options_p.integer_division = local_1c8.integer_division;
      options_p._2_6_ = local_1c8._2_6_;
      options_p.extensions = local_1c8.extensions;
      Parser::Parser((Parser *)&local_130,options_p);
      ErrorData::ErrorData(&local_1b0);
      pSVar4 = unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
               operator->((unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                           *)prepared);
      (*pSVar4->_vptr_SQLStatement[2])(local_1f0 + 8,pSVar4);
      Parser::ParseQuery((Parser *)&local_130,(string *)(local_1f0 + 8));
      ::std::__cxx11::string::~string((string *)(local_1f0 + 8));
      __u = (__uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_> *)
            vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
            ::get<true>((vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
                         *)&local_130,0);
      ::std::__uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>::
      operator=((__uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_> *
                )prepared,__u);
      ErrorData::~ErrorData(&local_1b0);
      ::std::
      vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
                 *)&local_130);
    }
LAB_019c317a:
    bVar2 = true;
  }
  if (local_210 != (element_type *)0x0) {
    (**(code **)(*(long *)local_210 + 8))();
  }
  if (!bVar2) {
    return (unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>
           )(unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>
             )this;
  }
  local_1f0 = (undefined1  [8])
              (prepared->internal).
              super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  statement = local_200;
LAB_019c319b:
  (prepared->internal).super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  PendingStatementOrPreparedStatement
            (this,lock,local_1f8,statement,
             (shared_ptr<duckdb::PreparedStatementData,_true> *)local_1f0,parameters);
  if (local_1f0 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_1f0 + 8))();
  }
  return (unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>)
         (unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>)
         this;
}

Assistant:

unique_ptr<PendingQueryResult> ClientContext::PendingStatementOrPreparedStatementInternal(
    ClientContextLock &lock, const string &query, unique_ptr<SQLStatement> statement,
    shared_ptr<PreparedStatementData> &prepared, const PendingQueryParameters &parameters) {
#ifdef DUCKDB_ALTERNATIVE_VERIFY
	if (statement && statement->type != StatementType::LOGICAL_PLAN_STATEMENT) {
		statement = statement->Copy();
	}
#endif
	// check if we are on AutoCommit. In this case we should start a transaction.
	if (statement && config.AnyVerification()) {
		// query verification is enabled
		// create a copy of the statement, and use the copy
		// this way we verify that the copy correctly copies all properties
		auto copied_statement = statement->Copy();
		switch (statement->type) {
		case StatementType::SELECT_STATEMENT: {
			// in case this is a select query, we verify the original statement
			ErrorData error;
			try {
				error = VerifyQuery(lock, query, std::move(statement), parameters.parameters);
			} catch (std::exception &ex) {
				error = ErrorData(ex);
			}
			if (error.HasError()) {
				// error in verifying query
				return ErrorResult<PendingQueryResult>(std::move(error), query);
			}
			statement = std::move(copied_statement);
			break;
		}
		default: {
#ifndef DUCKDB_ALTERNATIVE_VERIFY
			bool reparse_statement = true;
#else
			bool reparse_statement = false;
#endif
			statement = std::move(copied_statement);
			if (statement->type == StatementType::RELATION_STATEMENT) {
				reparse_statement = false;
			}
			if (reparse_statement) {
				try {
					Parser parser(GetParserOptions());
					ErrorData error;
					parser.ParseQuery(statement->ToString());
					statement = std::move(parser.statements[0]);
				} catch (const NotImplementedException &) {
					// ToString was not implemented, just use the copied statement
				}
			}
			break;
		}
		}
	}
	return PendingStatementOrPreparedStatement(lock, query, std::move(statement), prepared, parameters);
}